

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_line.c
# Opt level: O1

int dwarf_srclines_subprog_count
              (Dwarf_Line_Context line_context,Dwarf_Signed *count_out,Dwarf_Error *error)

{
  int iVar1;
  
  if ((line_context == (Dwarf_Line_Context)0x0) || (line_context->lc_magic != 0xd00d1111)) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x131);
LAB_001b3480:
    iVar1 = 1;
  }
  else {
    if (count_out != (Dwarf_Signed *)0x0) {
      if ((long)line_context->lc_subprogs_count < 0) {
        _dwarf_error_string(line_context->lc_dbg,error,500,
                            "DW_DLE_LINE_COUNT_WRONG Call to dwarf_srclines_subprog_count finds an Impossible subprogs count"
                           );
        goto LAB_001b3480;
      }
      *count_out = line_context->lc_subprogs_count;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
dwarf_srclines_subprog_count(Dwarf_Line_Context line_context,
    Dwarf_Signed * count_out,
    Dwarf_Error * error)
{
    if (!line_context ){
        _dwarf_error(NULL, error, DW_DLE_LINE_CONTEXT_BOTCH);
        return DW_DLV_ERROR;
    }
    if (line_context->lc_magic != DW_CONTEXT_MAGIC) {
        _dwarf_error(NULL, error, DW_DLE_LINE_CONTEXT_BOTCH);
        return DW_DLV_ERROR;
    }
    if (count_out) {
        Dwarf_Signed co =
            (Dwarf_Signed) line_context->lc_subprogs_count;
        if (co < 0) {
            _dwarf_error_string(line_context->lc_dbg,error,
                DW_DLE_LINE_COUNT_WRONG,
                "DW_DLE_LINE_COUNT_WRONG "
                "Call to dwarf_srclines_subprog_count "
                "finds an Impossible "
                "subprogs count");
            return DW_DLV_ERROR;
        }
        *count_out = co;
    }
    return DW_DLV_OK;
}